

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptPromiseCapabilitiesExecutorFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseCapabilitiesExecutorFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,
          JavascriptPromiseCapability *capability)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  DynamicType *type;
  Recycler *this_00;
  undefined4 *puVar4;
  JavascriptPromiseCapabilitiesExecutorFunction *this_01;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                          &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                           super_RecyclableObject,entryPoint,
                          (DynamicTypeHandler *)
                          &DeferredTypeHandler<&(bool_Js::JavascriptLibrary::InitializeFunction<false,false,false,false>(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)),Js::InitializeFunctionDeferredTypeHandlerFilter<false,false,false>,false,(unsigned_short)0,(unsigned_short)0>
                           ::defaultInstance,false,false);
  local_50 = (undefined1  [8])&JavascriptPromiseCapabilitiesExecutorFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x19d7;
  this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00bf2557;
    *puVar4 = 0;
  }
  this_01 = (JavascriptPromiseCapabilitiesExecutorFunction *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                      (this_00,0x48);
  if (this_01 == (JavascriptPromiseCapabilitiesExecutorFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa70,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00bf2557:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  JavascriptPromiseCapabilitiesExecutorFunction::JavascriptPromiseCapabilitiesExecutorFunction
            (this_01,type,(FunctionInfo *)JavascriptPromise::EntryInfo::CapabilitiesExecutorFunction
             ,capability);
  (*(this_01->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(this_01,0xd1,&DAT_1000000000002,2,0,0,0xf);
  return this_01;
}

Assistant:

JavascriptPromiseCapabilitiesExecutorFunction* JavascriptLibrary::CreatePromiseCapabilitiesExecutorFunction(JavascriptMethod entryPoint, JavascriptPromiseCapability* capability)
    {
        FunctionInfo* functionInfo = &Js::JavascriptPromise::EntryInfo::CapabilitiesExecutorFunction;
        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());
        JavascriptPromiseCapabilitiesExecutorFunction* function = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseCapabilitiesExecutorFunction, type, functionInfo, capability);

        function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(2), PropertyConfigurable, nullptr);

        return function;
    }